

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O3

void __thiscall leveldb::anon_unknown_3::DBIter::FindPrevUserEntry(DBIter *this)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  ulong uVar5;
  undefined4 extraout_var_00;
  long extraout_RDX;
  ulong extraout_RDX_00;
  ValueType VVar6;
  string empty;
  ParsedInternalKey ikey;
  char *local_88;
  size_type local_80;
  char local_78 [16];
  string *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  string *local_58;
  ParsedInternalKey local_50;
  
  if (this->direction_ != kReverse) {
    __assert_fail("direction_ == kReverse",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_iter.cc"
                  ,0xed,"void leveldb::(anonymous namespace)::DBIter::FindPrevUserEntry()");
  }
  iVar3 = (*this->iter_->_vptr_Iterator[2])();
  if ((char)iVar3 != '\0') {
    local_58 = &this->saved_key_;
    local_68 = &this->saved_value_;
    local_60 = &(this->saved_value_).field_2;
    VVar6 = kTypeDeletion;
    do {
      local_50.user_key.data_ = "";
      local_50.user_key.size_ = 0;
      bVar2 = ParseKey(this,&local_50);
      if ((bVar2) && (local_50.sequence <= this->sequence_)) {
        if (VVar6 != kTypeDeletion) {
          local_88 = (this->saved_key_)._M_dataplus._M_p;
          local_80 = (this->saved_key_)._M_string_length;
          iVar3 = (*this->user_comparator_->_vptr_Comparator[2])
                            (this->user_comparator_,&local_50,&local_88);
          if (iVar3 < 0) goto LAB_00110409;
        }
        VVar6 = local_50.type;
        if (local_50.type == kTypeDeletion) {
          (this->saved_key_)._M_string_length = 0;
          *(this->saved_key_)._M_dataplus._M_p = '\0';
          pcVar1 = (this->saved_value_)._M_dataplus._M_p;
          if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)pcVar1 == local_60) ||
             ((this->saved_value_).field_2._M_allocated_capacity < 0x100001)) {
            (this->saved_value_)._M_string_length = 0;
            *pcVar1 = '\0';
          }
          else {
            local_80 = 0;
            local_78[0] = '\0';
            local_88 = local_78;
            std::__cxx11::string::swap((string *)&local_88);
            if (local_88 != local_78) {
              operator_delete(local_88);
            }
          }
          VVar6 = kTypeDeletion;
        }
        else {
          iVar3 = (*this->iter_->_vptr_Iterator[9])();
          uVar5 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(this->saved_value_)._M_dataplus._M_p != local_60) {
            uVar5 = (this->saved_value_).field_2._M_allocated_capacity;
          }
          if (extraout_RDX + 0x100000U < uVar5) {
            local_88 = local_78;
            local_80 = 0;
            local_78[0] = '\0';
            std::__cxx11::string::swap((string *)&local_88);
            if (local_88 != local_78) {
              operator_delete(local_88);
            }
          }
          iVar4 = (*this->iter_->_vptr_Iterator[8])();
          if (extraout_RDX_00 < 8) {
            __assert_fail("internal_key.size() >= 8",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/dbformat.h"
                          ,0x5e,"Slice leveldb::ExtractUserKey(const Slice &)");
          }
          std::__cxx11::string::_M_replace
                    ((ulong)local_58,0,(char *)(this->saved_key_)._M_string_length,
                     CONCAT44(extraout_var_00,iVar4));
          std::__cxx11::string::_M_replace
                    ((ulong)local_68,0,(char *)(this->saved_value_)._M_string_length,
                     CONCAT44(extraout_var,iVar3));
        }
      }
      (*this->iter_->_vptr_Iterator[7])();
      iVar3 = (*this->iter_->_vptr_Iterator[2])();
    } while ((char)iVar3 != '\0');
    if (VVar6 != kTypeDeletion) {
LAB_00110409:
      this->valid_ = true;
      return;
    }
  }
  this->valid_ = false;
  (this->saved_key_)._M_string_length = 0;
  *(this->saved_key_)._M_dataplus._M_p = '\0';
  pcVar1 = (this->saved_value_)._M_dataplus._M_p;
  if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)pcVar1 == &(this->saved_value_).field_2) ||
     ((this->saved_value_).field_2._M_allocated_capacity < 0x100001)) {
    (this->saved_value_)._M_string_length = 0;
    *pcVar1 = '\0';
  }
  else {
    local_80 = 0;
    local_78[0] = '\0';
    local_88 = local_78;
    std::__cxx11::string::swap((string *)&local_88);
    if (local_88 != local_78) {
      operator_delete(local_88);
    }
  }
  this->direction_ = kForward;
  return;
}

Assistant:

void DBIter::FindPrevUserEntry() {
  assert(direction_ == kReverse);

  ValueType value_type = kTypeDeletion;
  if (iter_->Valid()) {
    do {
      ParsedInternalKey ikey;
      if (ParseKey(&ikey) && ikey.sequence <= sequence_) {
        if ((value_type != kTypeDeletion) &&
            user_comparator_->Compare(ikey.user_key, saved_key_) < 0) {
          // We encountered a non-deleted value in entries for previous keys,
          break;
        }
        value_type = ikey.type;
        if (value_type == kTypeDeletion) {
          saved_key_.clear();
          ClearSavedValue();
        } else {
          Slice raw_value = iter_->value();
          if (saved_value_.capacity() > raw_value.size() + 1048576) {
            std::string empty;
            swap(empty, saved_value_);
          }
          SaveKey(ExtractUserKey(iter_->key()), &saved_key_);
          saved_value_.assign(raw_value.data(), raw_value.size());
        }
      }
      iter_->Prev();
    } while (iter_->Valid());
  }

  if (value_type == kTypeDeletion) {
    // End
    valid_ = false;
    saved_key_.clear();
    ClearSavedValue();
    direction_ = kForward;
  } else {
    valid_ = true;
  }
}